

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void flag_test(Parameters *params)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ostream *poVar4;
  ulong *in_RDI;
  unique_ptr<unsigned_int,_void_(*)(void_*)> vals;
  ostream *out;
  size_t dwords;
  size_t words;
  size_t bytes;
  Parameters *in_stack_000001f8;
  uint32_t *in_stack_00000200;
  char *__p;
  ostream *this;
  unique_ptr<unsigned_int,_void_(*)(void_*)> *in_stack_ffffffffffffffb0;
  
  uVar1 = *in_RDI;
  uVar2 = *in_RDI;
  uVar3 = *in_RDI;
  this = (ostream *)&std::cerr;
  poVar4 = std::operator<<((ostream *)&std::cerr,"Will test ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*in_RDI);
  std::operator<<(poVar4," flags (");
  poVar4 = std::operator<<(this,"8 bit proc: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar1 >> 10);
  __p = "kB, ";
  std::operator<<(poVar4,"kB, ");
  poVar4 = std::operator<<(this,"16 bit proc: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar2 * 2 >> 10);
  std::operator<<(poVar4,__p);
  poVar4 = std::operator<<(this,"32-bit proc: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uVar3 << 2) >> 10);
  poVar4 = std::operator<<(poVar4,"kB) repeated ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[1]);
  poVar4 = std::operator<<(poVar4," times.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  aligned_malloc((size_t)this,(size_t)__p);
  std::unique_ptr<unsigned_int,void(*)(void*)>::unique_ptr<void(*)(void*),void>
            ((unique_ptr<unsigned_int,_void_(*)(void_*)> *)this,(pointer)__p,
             (__enable_if_t<_is_lvalue_reference<void_(*)(void_*)>::value,_void_(*&&)(void_*)>)
             0x173178);
  std::unique_ptr<unsigned_int,_void_(*)(void_*)>::get
            ((unique_ptr<unsigned_int,_void_(*)(void_*)> *)this);
  benchmark(in_stack_00000200,in_stack_000001f8);
  std::unique_ptr<unsigned_int,_void_(*)(void_*)>::~unique_ptr(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void flag_test(const Parameters& params) {
    const size_t bytes  = params.items_count * sizeof(uint8_t);
    const size_t words  = params.items_count * sizeof(uint16_t);
    const size_t dwords = params.items_count * sizeof(uint32_t);
    std::ostream& out = std::cerr;

    out << "Will test " << params.items_count << " flags (";
    out << "8 bit proc: " << bytes / 1024 << "kB, ";
    out << "16 bit proc: " << words / 1024 << "kB, ";
    out << "32-bit proc: " << dwords / 1024 << "kB) repeated " << params.iterations << " times." << std::endl;

    std::unique_ptr<uint32_t, decltype(&aligned_free)> vals(
        static_cast<uint32_t*>(aligned_malloc(dwords, POSPOPCNT_SIMD_ALIGNMENT)),
        &aligned_free);
        
    benchmark(vals.get(), params);
}